

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_reallocstack(lua_State *L,int newsize,int raiseerror)

{
  long lVar1;
  lu_byte lVar2;
  UpVal *pUVar3;
  CallInfo *pCVar4;
  int iVar5;
  StkId pSVar6;
  lu_byte *plVar7;
  anon_union_16_2_5131162a_for_u *paVar8;
  CallInfo **ppCVar9;
  StkId oldstack;
  long lVar10;
  
  pSVar6 = (L->stack_last).p;
  oldstack = (L->stack).p;
  lVar2 = L->l_G->gcstopem;
  (L->top).p = (StkId)((long)(L->top).p - (long)oldstack);
  (L->tbclist).p = (StkId)((long)(L->tbclist).p - (long)oldstack);
  paVar8 = (anon_union_16_2_5131162a_for_u *)&L->openupval;
  while (pUVar3 = (paVar8->open).next, pUVar3 != (UpVal *)0x0) {
    (pUVar3->v).p = (TValue *)((long)(pUVar3->v).p - (L->stack).offset);
    paVar8 = &pUVar3->u;
  }
  ppCVar9 = &L->ci;
  while (pCVar4 = *ppCVar9, pCVar4 != (CallInfo *)0x0) {
    (pCVar4->top).p = (StkId)((long)(pCVar4->top).p - (L->stack).offset);
    (pCVar4->func).p = (StkId)((long)(pCVar4->func).p - (L->stack).offset);
    ppCVar9 = &pCVar4->previous;
  }
  L->l_G->gcstopem = '\x01';
  lVar10 = ((long)pSVar6 - (long)oldstack) * 0x10000000 + 0x500000000 >> 0x20;
  lVar1 = (long)newsize + 5;
  pSVar6 = (StkId)luaM_realloc_(L,oldstack,lVar10 * 0x10,lVar1 * 0x10);
  L->l_G->gcstopem = lVar2;
  if (pSVar6 == (StkId)0x0) {
    correctstack(L,oldstack);
    iVar5 = 0;
    if (raiseerror != 0) {
      luaD_throw(L,'\x04');
    }
  }
  else {
    (L->stack).p = pSVar6;
    correctstack(L,oldstack);
    (L->stack_last).p = (L->stack).p + newsize;
    plVar7 = &(&pSVar6->val)[lVar10].tt_;
    iVar5 = 1;
    for (; lVar10 < lVar1; lVar10 = lVar10 + 1) {
      *plVar7 = '\0';
      plVar7 = plVar7 + 0x10;
    }
  }
  return iVar5;
}

Assistant:

int luaD_reallocstack (lua_State *L, int newsize, int raiseerror) {
  int oldsize = stacksize(L);
  int i;
  StkId newstack;
  StkId oldstack = L->stack.p;
  lu_byte oldgcstop = G(L)->gcstopem;
  lua_assert(newsize <= MAXSTACK || newsize == ERRORSTACKSIZE);
  relstack(L);  /* change pointers to offsets */
  G(L)->gcstopem = 1;  /* stop emergency collection */
  newstack = luaM_reallocvector(L, oldstack, oldsize + EXTRA_STACK,
                                   newsize + EXTRA_STACK, StackValue);
  G(L)->gcstopem = oldgcstop;  /* restore emergency collection */
  if (l_unlikely(newstack == NULL)) {  /* reallocation failed? */
    correctstack(L, oldstack);  /* change offsets back to pointers */
    if (raiseerror)
      luaM_error(L);
    else return 0;  /* do not raise an error */
  }
  L->stack.p = newstack;
  correctstack(L, oldstack);  /* change offsets back to pointers */
  L->stack_last.p = L->stack.p + newsize;
  for (i = oldsize + EXTRA_STACK; i < newsize + EXTRA_STACK; i++)
    setnilvalue(s2v(newstack + i)); /* erase new segment */
  return 1;
}